

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

void __thiscall
Inferences::InductionClauseIterator::performIntInduction
          (InductionClauseIterator *this,InductionContext *context,Entry *e,bool increasing,
          Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
          bound1,TermLiteralClause *optionalBound2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined *this_00;
  Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound> CVar3;
  uint fn;
  int iVar4;
  TermList TVar5;
  Formula *pFVar6;
  Formula *pFVar7;
  Formula *pFVar8;
  Formula *pFVar9;
  AtomicFormula *this_01;
  Literal *pLVar10;
  AtomicFormula *this_02;
  AtomicFormula *this_03;
  List<Kernel::Formula_*> *pLVar11;
  AtomicFormula *this_04;
  Formula *this_05;
  Formula *this_06;
  Formula *this_07;
  Formula *this_08;
  undefined7 in_register_00000009;
  uint64_t uVar12;
  uint64_t uVar13;
  TermList arg2;
  char cVar14;
  InferenceRule rule;
  bool bVar15;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  initializer_list<Kernel::TermList> __l_02;
  allocator_type local_d1;
  undefined8 local_d0;
  AtomicFormula *local_c8;
  AtomicFormula *local_c0;
  InductionContext *local_b8;
  TermList local_b0;
  ClauseStack cls;
  Substitution subst;
  
  CVar3._inner = bound1._inner;
  this_00 = Kernel::theory;
  local_d0 = CONCAT71(in_register_00000009,increasing);
  arg2._content = (uint64_t)optionalBound2;
  Kernel::IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)&subst,(int)local_d0 - 1U | 1);
  TVar5._content =
       (uint64_t)Kernel::Theory::representConstant((Theory *)this_00,(IntegerConstantType *)&subst);
  Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)&subst);
  cls._capacity._0_1_ = bound1._inner._content[0];
  cls._capacity._1_1_ = bound1._inner._content[1];
  cls._capacity._2_1_ = bound1._inner._content[2];
  cls._capacity._3_1_ = bound1._inner._content[3];
  cls._capacity._4_1_ = bound1._inner._content[4];
  cls._capacity._5_1_ = bound1._inner._content[5];
  cls._capacity._6_1_ = bound1._inner._content[6];
  cls._capacity._7_1_ = bound1._inner._content[7];
  __l._M_len = 1;
  __l._M_array = (iterator)&cls;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst,__l,
             (allocator_type *)&local_b0);
  pFVar6 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst,
                      true,(Substitution *)0x0);
  std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
            ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst);
  cls._capacity = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&cls;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst,__l_00,
             (allocator_type *)&local_b0);
  pFVar7 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst,
                      true,(Substitution *)0x0);
  std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
            ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&subst);
  subst._map._timestamp = 1;
  subst._map._afterLast._4_4_ = 0;
  subst._map._size = 0;
  subst._map._deleted = 0;
  subst._map._capacityIndex = 0;
  subst._map._capacity = 0;
  subst._map._20_8_ = 0;
  subst._map._28_8_ = 0;
  local_b0._content = 5;
  __l_01._M_len = 1;
  __l_01._M_array = &local_b0;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls,__l_01,&local_d1);
  pFVar8 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls,
                      true,&subst);
  local_b8 = context;
  std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
            ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls);
  fn = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_PLUS);
  local_b0._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x1,TVar5);
  uVar1 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = &local_b0;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls,__l_02,&local_d1);
  pFVar9 = InductionContext::getFormula
                     (local_b8,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls,
                      true,(Substitution *)0x0);
  std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
            ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&cls);
  if ((performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
       ::less == '\0') &&
     (iVar4 = __cxa_guard_acquire(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                                   ::less), iVar4 != 0)) {
    performIntInduction::less = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_LESS);
    __cxa_guard_release(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                         ::less);
  }
  this_01 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
  uVar12 = bound1._inner._content._0_8_;
  if ((InferenceRule)local_d0 != '\0') {
    uVar12 = uVar1;
  }
  TVar5._content = uVar1;
  if ((InferenceRule)local_d0 != '\0') {
    TVar5._content = bound1._inner._content._0_8_;
  }
  pLVar10 = Kernel::Literal::create2
                      ((Literal *)(ulong)performIntInduction::less,0,SUB81(uVar12,0),TVar5,arg2);
  Kernel::AtomicFormula::AtomicFormula(this_01,pLVar10);
  bVar15 = true;
  if (((undefined1  [36])CVar3._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if (*(uint *)(bound1._inner._content._16_8_ + 8) == performIntInduction::less) {
      bVar15 = (*(byte *)(bound1._inner._content._16_8_ + 0x28) & 4) == 0;
    }
    else {
      bVar15 = false;
    }
  }
  local_c8 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
  uVar12 = 5;
  uVar13 = uVar12;
  if (bVar15 != (bool)(InferenceRule)local_d0) {
    uVar13 = bound1._inner._content._0_8_;
  }
  TVar5._content = bound1._inner._content._0_8_;
  if (bVar15 != (bool)(InferenceRule)local_d0) {
    TVar5._content = uVar12;
  }
  pLVar10 = Kernel::Literal::create2
                      ((Literal *)(ulong)performIntInduction::less,(uint)(bVar15 ^ 1),
                       SUB81(uVar13,0),TVar5,arg2);
  Kernel::AtomicFormula::AtomicFormula(local_c8,pLVar10);
  if ((optionalBound2 == (TermLiteralClause *)0x0) || (optionalBound2->literal == (Literal *)0x0)) {
    cVar14 = '\0';
  }
  else {
    uVar13 = (optionalBound2->term).super_TermList._content;
    if (bound1._inner._content._0_8_ == uVar13) goto LAB_003f8071;
    local_c0 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    TVar5._content = uVar1;
    uVar2 = uVar13;
    if ((InferenceRule)local_d0 != '\0') {
      TVar5._content = uVar13;
      uVar2 = uVar1;
    }
    pLVar10 = Kernel::Literal::create2
                        ((Literal *)(ulong)performIntInduction::less,1,SUB81(uVar2,0),TVar5,arg2);
    Kernel::AtomicFormula::AtomicFormula(local_c0,pLVar10);
    if ((optionalBound2->literal->super_Term)._functor == performIntInduction::less) {
      bVar15 = ((optionalBound2->literal->super_Term)._args[0]._content & 4) == 0;
    }
    else {
      bVar15 = false;
    }
    this_02 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    TVar5._content = uVar12;
    if (bVar15 != (bool)(InferenceRule)local_d0) {
      TVar5._content = uVar13;
      uVar13 = uVar12;
    }
    pLVar10 = Kernel::Literal::create2
                        ((Literal *)(ulong)performIntInduction::less,(uint)(bVar15 ^ 1),
                         SUB81(uVar13,0),TVar5,arg2);
    Kernel::AtomicFormula::AtomicFormula(this_02,pLVar10);
    this_03 = (AtomicFormula *)Kernel::JunctionFormula::operator_new(0x30);
    pLVar11 = Lib::List<Kernel::Formula_*>::singleton(&local_c0->super_Formula);
    pLVar11 = Lib::List<Kernel::Formula_*>::cons((Formula *)this_01,pLVar11);
    Kernel::Formula::Formula((Formula *)this_03,AND);
    this_03->_literal = (Literal *)pLVar11;
    this_04 = (AtomicFormula *)Kernel::JunctionFormula::operator_new(0x30);
    pLVar11 = Lib::List<Kernel::Formula_*>::singleton((Formula *)this_02);
    pLVar11 = Lib::List<Kernel::Formula_*>::cons(&local_c8->super_Formula,pLVar11);
    Kernel::Formula::Formula((Formula *)this_04,AND);
    this_04->_literal = (Literal *)pLVar11;
    cVar14 = '\x01';
    this_01 = this_03;
    local_c8 = this_04;
  }
  this_05 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
  this_06 = (Formula *)Kernel::JunctionFormula::operator_new(0x30);
  this_07 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
  this_08 = (Formula *)Kernel::JunctionFormula::operator_new(0x30);
  pLVar11 = Lib::List<Kernel::Formula_*>::singleton(pFVar7);
  pLVar11 = Lib::List<Kernel::Formula_*>::cons(&this_01->super_Formula,pLVar11);
  Kernel::Formula::Formula(this_08,AND);
  *(List<Kernel::Formula_*> **)(this_08 + 1) = pLVar11;
  Kernel::Formula::Formula(this_07,IMP);
  *(Formula **)(this_07 + 1) = this_08;
  this_07[1]._label._M_dataplus._M_p = (pointer)pFVar9;
  pFVar7 = Kernel::Formula::quantify(this_07);
  pLVar11 = Lib::List<Kernel::Formula_*>::singleton(pFVar7);
  pLVar11 = Lib::List<Kernel::Formula_*>::cons(pFVar6,pLVar11);
  Kernel::Formula::Formula(this_06,AND);
  *(List<Kernel::Formula_*> **)(this_06 + 1) = pLVar11;
  pFVar6 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
  Kernel::Formula::Formula(pFVar6,IMP);
  *(AtomicFormula **)(pFVar6 + 1) = local_c8;
  pFVar6[1]._label._M_dataplus._M_p = (pointer)pFVar8;
  pFVar6 = Kernel::Formula::quantify(pFVar6);
  Kernel::Formula::Formula(this_05,IMP);
  *(Formula **)(this_05 + 1) = this_06;
  this_05[1]._label._M_dataplus._M_p = (pointer)pFVar6;
  if (((undefined1  [36])CVar3._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if ((InferenceRule)local_d0 == INPUT) {
      rule = cVar14 * '\x02' | INT_INF_DOWN_INDUCTION_AXIOM;
    }
    else {
      rule = cVar14 * '\x02' | INT_INF_UP_INDUCTION_AXIOM;
    }
  }
  else {
    rule = (InferenceRule)local_d0 ^ INT_DB_DOWN_INDUCTION_AXIOM;
  }
  produceClauses(&cls,this,this_05,rule,local_b8,
                 (DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0);
  Indexing::InductionFormulaIndex::Entry::add(e,&cls,&subst);
  Lib::Stack<Kernel::Clause_*>::~Stack(&cls);
LAB_003f8071:
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&subst._map);
  return;
}

Assistant:

void InductionClauseIterator::performIntInduction(const InductionContext& context, InductionFormulaIndex::Entry* e, bool increasing, Coproduct<TermLiteralClause, DefaultBound> bound1, const TermLiteralClause* optionalBound2)
{
  TermList b1(bound1.apply([](auto x) { return x.term; }));
  TermList one(theory->representConstant(IntegerConstantType(increasing ? 1 : -1)));

  TermList x(0,false);
  TermList y(1,false);

  // create L[b1]
  Formula* Lb1 = context.getFormula({ b1 },true);

  // create L[X]
  Formula* Lx = context.getFormula({ x },true);

  // create L[Y]
  Substitution subst;
  Formula* Ly = context.getFormula({ y },true,&subst);

  // create L[X+1] or L[X-1]
  TermList fpo(Term::create2(env.signature->getInterpretingSymbol(Theory::INT_PLUS),x,one));
  Formula* Lxpo = context.getFormula({ fpo },true);

  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  // create X>=b1 (which is ~X<b1) or X<=b1 (which is ~b1<X)
  Formula* Lxcompb1 = new AtomicFormula(Literal::create2(less,false,(increasing ? x : b1),(increasing ? b1 : x)));
  // create Y>=b1 (which is ~Y<b1), or Y>b1, or Y<=b1 (which is ~b1<Y), or Y<b1
  // This comparison is mirroring the structure of bound1.literal, which is "b1 <comparison> inductionTerm".
  // If bound1.literal is nullptr, we are using the default bound with the comparison sign >= or <=.
  const bool isBound1Equal = bound1.match(
      [](TermLiteralClause const& bound1) { return (bound1.literal->functor() == less && bound1.literal->isNegative()); },
      [](DefaultBound) { return true; });
  const bool isBound1FirstArg = (increasing != isBound1Equal);
  Formula* Lycompb1 = new AtomicFormula(Literal::create2(
        less, !isBound1Equal, (isBound1FirstArg ? b1 : y), (isBound1FirstArg ? y : b1)));

  Formula* FxInterval;
  Formula* FyInterval;
  const bool isDefaultBound = bound1.template is<DefaultBound>();
  const bool hasBound2 = ((optionalBound2 != nullptr) && (optionalBound2->literal != nullptr));
  // Also resolve the hypothesis with comparisons with bound(s) (if the bound(s) are present/not default).
  if (hasBound2) {
    // Finite interval induction, use two bounds on both x and y.
    TermList b2(optionalBound2->term);
    if (b1 == b2) {
      return;
    }
    // create X<b2 or X>b2 (which is b2<X)
    Formula* Lxcompb2 = new AtomicFormula(Literal::create2(less, true, (increasing ? x : b2), (increasing ? b2 : x)));
    const bool isBound2Equal = (optionalBound2->literal->functor() == less && optionalBound2->literal->isNegative());
    const bool isBound2FirstArg = (increasing == isBound2Equal);
    // create Y<b2, or Y<=b2 (which is ~b2<Y) or Y>b2, or Y>=b2 (which is ~Y<b2)
    Formula* Lycompb2 = new AtomicFormula(Literal::create2(
          less, !isBound2Equal, (isBound2FirstArg ? b2 : y), (isBound2FirstArg ? y : b2)));
    FxInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lxcompb1, FormulaList::singleton(Lxcompb2)));
    FyInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lycompb1, FormulaList::singleton(Lycompb2)));
  } else {
    // Infinite interval induction (either with default bound or not), use only one bound on both x and y.
    FxInterval = Lxcompb1;
    FyInterval = Lycompb1;
  }

  // Create the hypothesis, with FxInterval and FyInterval being as described
  // in the comment above this function.
  Formula* hyp = new BinaryFormula(Connective::IMP,
                   new JunctionFormula(Connective::AND,FormulaList::cons(Lb1,FormulaList::singleton(
                     Formula::quantify(new BinaryFormula(Connective::IMP,
                       new JunctionFormula(Connective::AND, FormulaList::cons(FxInterval,FormulaList::singleton(Lx))),
                       Lxpo))))),
                   Formula::quantify(new BinaryFormula(Connective::IMP,FyInterval,Ly)));

  InferenceRule rule =
      isDefaultBound
          ? (increasing ? InferenceRule::INT_DB_UP_INDUCTION_AXIOM : InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM)
          : (increasing ? (hasBound2 ? InferenceRule::INT_FIN_UP_INDUCTION_AXIOM : InferenceRule::INT_INF_UP_INDUCTION_AXIOM)
                        : (hasBound2 ? InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM : InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM));

  auto cls = produceClauses(hyp, rule, context);
  e->add(std::move(cls), std::move(subst));
}